

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool Curl_compareheader(char *headerline,char *header,size_t hlen,char *content,size_t clen)

{
  bool bVar1;
  int iVar2;
  char *local_50;
  char *end;
  char *start;
  size_t len;
  size_t clen_local;
  char *content_local;
  size_t hlen_local;
  char *header_local;
  char *headerline_local;
  
  iVar2 = Curl_strncasecompare(headerline,header,hlen);
  if (iVar2 != 0) {
    end = headerline + hlen;
    while( true ) {
      bVar1 = false;
      if ((((*end != '\0') && (bVar1 = true, *end != ' ')) && (bVar1 = true, *end != '\t')) &&
         (bVar1 = false, '\t' < *end)) {
        bVar1 = *end < '\x0e';
      }
      if (!bVar1) break;
      end = end + 1;
    }
    local_50 = strchr(end,0xd);
    if ((local_50 == (char *)0x0) && (local_50 = strchr(end,10), local_50 == (char *)0x0)) {
      local_50 = strchr(end,0);
    }
    for (start = local_50 + -(long)end; clen <= start; start = start + -1) {
      iVar2 = Curl_strncasecompare(end,content,clen);
      if (iVar2 != 0) {
        return true;
      }
      end = end + 1;
    }
  }
  return false;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const size_t hlen,   /* len of the keyword in bytes */
                   const char *content, /* content string to find */
                   const size_t clen)   /* len of the content in bytes */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t len;
  const char *start;
  const char *end;
  DEBUGASSERT(hlen);
  DEBUGASSERT(clen);
  DEBUGASSERT(header);
  DEBUGASSERT(content);

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all whitespace */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */

  /* find the content string in the rest of the line */
  for(; len >= clen; len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}